

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLayerComparer::operator()
          (ImageLayerComparer *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  TextureType TVar1;
  ChannelType CVar2;
  LayeredImage *this_00;
  bool bVar3;
  TextureFormat *pTVar4;
  char *__s;
  undefined8 *puVar5;
  long *plVar6;
  TextureFormat TVar7;
  long *plVar8;
  string comparisonName;
  string comparisonDesc;
  ConstPixelBufferAccess referenceSlice;
  undefined1 local_260 [16];
  ChannelOrder local_250;
  int iStack_24c;
  ChannelOrder CStack_248;
  ChannelType CStack_244;
  TextureFormat local_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  Vec4 local_218;
  long local_208;
  undefined8 uStack_200;
  TextureFormat local_1f0 [2];
  long local_1e0 [2];
  ConstPixelBufferAccess local_1d0;
  undefined1 local_1a8 [16];
  ChannelOrder local_198;
  int iStack_194;
  ChannelOrder CStack_190;
  ChannelType local_18c;
  TextureFormat local_188;
  ios_base local_138 [264];
  
  this_00 = this->m_reference;
  TVar1 = this_00->m_type;
  if (TVar1 == TEXTURETYPE_CUBE) {
    pTVar4 = (TextureFormat *)
             ((this_00->m_texCube).m_ptr)->m_access
             [(uint)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
                    [sliceOrFaceNdx]].
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_260._8_8_ = pTVar4[1];
    local_188 = pTVar4[4];
    local_250 = pTVar4[2].order;
    iStack_24c = (int)*(undefined8 *)&pTVar4[2].type;
    CStack_248 = (ChannelOrder)((ulong)*(undefined8 *)&pTVar4[2].type >> 0x20);
    CStack_244 = pTVar4[3].type;
    local_260._0_8_ = *pTVar4;
  }
  else {
    LayeredImage::getSliceAccessInternal((PixelBufferAccess *)local_1a8,this_00,sliceOrFaceNdx);
    local_260._8_8_ = local_1a8._8_8_;
    local_250 = local_198;
    iStack_24c = iStack_194;
    CStack_248 = CStack_190;
    CStack_244 = local_18c;
    local_260._0_8_ = local_1a8._0_8_;
  }
  local_240 = local_188;
  tcu::getSubregion(&local_1d0,(ConstPixelBufferAccess *)local_260,0,0,
                    (this->m_relevantRegion).m_data[0],(this->m_relevantRegion).m_data[1]);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pTVar4 = (TextureFormat *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x1c3cbce)
  ;
  local_260._0_8_ = &local_250;
  TVar7 = (TextureFormat)(pTVar4 + 2);
  if (*pTVar4 == TVar7) {
    local_250 = (ChannelOrder)*(undefined8 *)TVar7;
    iStack_24c = (int)((ulong)*(undefined8 *)TVar7 >> 0x20);
    CStack_248 = pTVar4[3].order;
    CStack_244 = pTVar4[3].type;
  }
  else {
    local_250 = (ChannelOrder)*(undefined8 *)TVar7;
    iStack_24c = (int)((ulong)*(undefined8 *)TVar7 >> 0x20);
    local_260._0_8_ = *pTVar4;
  }
  local_260._8_8_ = pTVar4[1];
  *pTVar4 = TVar7;
  pTVar4[1].order = R;
  pTVar4[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar4[2].order = R;
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (TVar1 == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c4f134)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,__s,(allocator<char> *)local_1f0);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x1cb8076);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_1f0,0,(char *)0x0,0x1c4fc47);
  }
  local_218.m_data._0_8_ = &local_208;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_208 = *plVar6;
    uStack_200 = puVar5[3];
  }
  else {
    local_208 = *plVar6;
    local_218.m_data._0_8_ = (long *)*puVar5;
  }
  local_218.m_data._8_8_ = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x1c4fc34);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_228 = *plVar8;
    lStack_220 = plVar6[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar8;
    local_238 = (long *)*plVar6;
  }
  local_230 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((long *)local_218.m_data._0_8_ != &local_208) {
    operator_delete((void *)local_218.m_data._0_8_,local_208 + 1);
  }
  if (TVar1 == TEXTURETYPE_CUBE) {
    if ((ChannelOrder *)local_1a8._0_8_ == &local_198) goto LAB_0146e4a0;
    local_1e0[0] = CONCAT44(iStack_194,local_198);
  }
  else {
    local_1a8._0_8_ = local_1f0[0];
    if (local_1f0[0] == (TextureFormat)local_1e0) goto LAB_0146e4a0;
  }
  operator_delete((void *)local_1a8._0_8_,local_1e0[0] + 1);
LAB_0146e4a0:
  CVar2 = (this->m_reference->m_format).type;
  if ((((ulong)CVar2 < 0x22) && ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) != 0)) ||
     (CVar2 - SIGNED_INT8 < 3)) {
    local_218.m_data[0] = 0.0;
    local_218.m_data[1] = 0.0;
    local_218.m_data[2] = 0.0;
    local_218.m_data[3] = 0.0;
    bVar3 = tcu::intThresholdCompare
                      (log,(char *)local_260._0_8_,(char *)local_238,&local_1d0,resultSlice,
                       (UVec4 *)&local_218,COMPARE_LOG_RESULT);
  }
  else {
    local_218.m_data[0] = 0.01;
    local_218.m_data[1] = 0.01;
    local_218.m_data[2] = 0.01;
    local_218.m_data[3] = 0.01;
    bVar3 = tcu::floatThresholdCompare
                      (log,(char *)local_260._0_8_,(char *)local_238,&local_1d0,resultSlice,
                       &local_218,COMPARE_LOG_RESULT);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if ((ChannelOrder *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,CONCAT44(iStack_24c,local_250) + 1);
  }
  return bVar3;
}

Assistant:

bool operator() (TestLog& log, const tcu::ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool						isCube				= m_reference.getImageType() == TEXTURETYPE_CUBE;
		const ConstPixelBufferAccess	referenceSlice		= tcu::getSubregion(isCube ? m_reference.getCubeFaceAccess(glslImageFuncZToCubeFace(sliceOrFaceNdx))
																					   : m_reference.getSliceAccess(sliceOrFaceNdx),
																				0, 0, m_relevantRegion.x(), m_relevantRegion.y());

		const string comparisonName = "Comparison" + toString(sliceOrFaceNdx);
		const string comparisonDesc = "Image Comparison, "
									+ (isCube ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
											  : "slice " + toString(sliceOrFaceNdx));

		if (isFormatTypeInteger(m_reference.getFormat().type))
			return tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			return tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
	}